

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O2

void __thiscall Emulator::Emulator(Emulator *this,string *_filename)

{
  Sound_Queue *this_00;
  
  this->_vptr_Emulator = (_func_int **)&PTR__Emulator_0011ca28;
  std::__cxx11::string::string((string *)&this->filename,(string *)_filename);
  SDL_Init(0xf231);
  SDL_SetHint("SDL_EMSCRIPTEN_KEYBOARD_ELEMENT","#canvas");
  SDL_CreateWindowAndRenderer(0x100,0xf0,0,&window,&renderer);
  SDL_SetWindowTitle(window,"NESEmulator");
  SDL_SetHint("SDL_RENDER_SCALE_QUALITY","linear");
  surface = (SDL_Surface *)SDL_CreateRGBSurface(0,0x100,0xf0,0x20,0,0,0,0);
  texture = (SDL_Texture *)SDL_CreateTexture(renderer,0x16362004,1,0x100,0xf0);
  SDL_RenderClear(renderer);
  vsyncEvent = SDL_RegisterEvents(1);
  this_00 = (Sound_Queue *)operator_new(0x20);
  Sound_Queue::Sound_Queue(this_00);
  sound_queue = this_00;
  Sound_Queue::init(this_00,(EVP_PKEY_CTX *)0xac44);
  ticks = SDL_GetTicks();
  return;
}

Assistant:

Emulator::Emulator(std::string _filename) : filename(move(_filename)) {
    SDL_Init(SDL_INIT_EVERYTHING);
    SDL_SetHint(SDL_HINT_EMSCRIPTEN_KEYBOARD_ELEMENT, "#canvas");
    SDL_CreateWindowAndRenderer(SCREEN_WIDTH, SCREEN_HEIGHT, 0, &window, &renderer);
    SDL_SetWindowTitle(window, "NESEmulator");
    SDL_SetHint(SDL_HINT_RENDER_SCALE_QUALITY, "linear");
    surface = SDL_CreateRGBSurface(0, SCREEN_WIDTH, SCREEN_HEIGHT, 32, 0, 0, 0, 0);
    texture = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ARGB8888, SDL_TEXTUREACCESS_STREAMING, SCREEN_WIDTH,
                                SCREEN_HEIGHT);
    SDL_RenderClear(renderer);
    vsyncEvent = SDL_RegisterEvents(1);
    sound_queue = new Sound_Queue;
    sound_queue->init(sample_rate);
    ticks = SDL_GetTicks();
}